

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

string * cppcms::util::escape(string *s)

{
  uint uVar1;
  char *pcVar2;
  ulong in_RSI;
  string *in_RDI;
  char c;
  uint len;
  uint i;
  string *content;
  uint local_18;
  
  std::__cxx11::string::string((string *)in_RDI);
  uVar1 = std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)in_RDI);
  for (local_18 = 0; local_18 < uVar1; local_18 = local_18 + 1) {
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI);
    switch(*pcVar2) {
    case '\"':
      std::__cxx11::string::operator+=((string *)in_RDI,"&quot;");
      break;
    default:
      std::__cxx11::string::operator+=((string *)in_RDI,*pcVar2);
      break;
    case '&':
      std::__cxx11::string::operator+=((string *)in_RDI,"&amp;");
      break;
    case '\'':
      std::__cxx11::string::operator+=((string *)in_RDI,"&#39;");
      break;
    case '<':
      std::__cxx11::string::operator+=((string *)in_RDI,"&lt;");
      break;
    case '>':
      std::__cxx11::string::operator+=((string *)in_RDI,"&gt;");
    }
  }
  return in_RDI;
}

Assistant:

std::string escape(std::string const &s)
{
	std::string content;
	unsigned i,len=s.size();
	content.reserve(len*3/2);
	for(i=0;i<len;i++) {
		char c=s[i];
		switch(c){
			case '<': content+="&lt;"; break;
			case '>': content+="&gt;"; break;
			case '&': content+="&amp;"; break;
			case '\"': content+="&quot;"; break;
			case '\'': content+="&#39;"; break;
			default: content+=c;
		}
	}
	return content;
}